

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlVertex3f(float x,float y,float z)

{
  Matrix mat;
  int iVar1;
  Vector3 VVar2;
  undefined8 local_50;
  float local_48;
  undefined8 local_20;
  Vector3 vec;
  float z_local;
  float y_local;
  float x_local;
  
  local_20 = CONCAT44(y,x);
  vec.x = z;
  if (RLGL.State.transformRequired) {
    VVar2.z = z;
    VVar2.x = x;
    VVar2.y = y;
    mat._8_8_ = RLGL.State.transform._8_8_;
    mat._0_8_ = RLGL.State.transform._0_8_;
    mat._16_8_ = RLGL.State.transform._16_8_;
    mat._24_8_ = RLGL.State.transform._24_8_;
    mat._32_8_ = RLGL.State.transform._32_8_;
    mat._40_8_ = RLGL.State.transform._40_8_;
    mat._48_8_ = RLGL.State.transform._48_8_;
    mat._56_8_ = RLGL.State.transform._56_8_;
    VVar2 = Vector3Transform(VVar2,mat);
    local_50 = VVar2._0_8_;
    local_48 = VVar2.z;
    local_20 = local_50;
    vec.x = local_48;
  }
  if ((RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter <
      (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].elementsCount * 4) {
    (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vertices
    [(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter * 3] =
         (float)local_20;
    (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vertices
    [(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter * 3 + 1] =
         local_20._4_4_;
    (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vertices
    [(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter * 3 + 2] = vec.x
    ;
    (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter =
         (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter + 1;
    iVar1 = (RLGL.currentBatch)->drawsCounter + -1;
    (RLGL.currentBatch)->draws[iVar1].vertexCount =
         (RLGL.currentBatch)->draws[iVar1].vertexCount + 1;
  }
  else {
    TraceLog(5,"RLGL: Batch elements overflow");
  }
  return;
}

Assistant:

void rlVertex3f(float x, float y, float z)
{
    Vector3 vec = { x, y, z };

    // Transform provided vector if required
    if (RLGL.State.transformRequired) vec = Vector3Transform(vec, RLGL.State.transform);

    // Verify that current vertex buffer elements limit has not been reached
    if (RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter < (RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].elementsCount*4))
    {
        RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vertices[3*RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter] = vec.x;
        RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vertices[3*RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter + 1] = vec.y;
        RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vertices[3*RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter + 2] = vec.z;
        RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter++;

        RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount++;
    }
    else TRACELOG(LOG_ERROR, "RLGL: Batch elements overflow");
}